

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

uint processorstop(logdir *ld)

{
  char *from;
  int iVar1;
  uint uVar2;
  char f [28];
  
  if (ld->ppid != 0) {
    sig_unblock(sig_hangup);
    while (iVar1 = wait_pid(&wstat,ld->ppid), iVar1 == -1) {
      pause2("error waiting for processor",ld->name);
    }
    sig_block(sig_hangup);
    ld->ppid = 0;
  }
  iVar1 = ld->fddir;
  uVar2 = 1;
  if (iVar1 != -1) {
    while (iVar1 = fchdir(iVar1), iVar1 == -1) {
      pause2("unable to change directory, want processor",ld->name);
      iVar1 = ld->fddir;
    }
    if ((uint)wstat < 0x100) {
      from = ld->fnsave;
      ld->fnsave[0x1a] = 't';
      byte_copy(f,0x1a,from);
      f[0x1a] = 's';
      f[0x1b] = '\0';
      while (iVar1 = rename(from,f), iVar1 == -1) {
        pause2("unable to rename processed",ld->name);
      }
      while (iVar1 = chmod(f,0x1e4), iVar1 == -1) {
        pause2("unable to set mode of processed",ld->name);
      }
      ld->fnsave[0x1a] = 'u';
      iVar1 = unlink(from);
      if (iVar1 == -1) {
        strerr_warn("svlogd: warning: ","unable to unlink: ",ld->name,"/",from,(char *)0x0,
                    (strerr *)0x0);
      }
      while (iVar1 = rename("newstate","state"), iVar1 == -1) {
        pause2("unable to rename state",ld->name);
      }
      if (verbose != 0) {
        strerr_warn("svlogd: info: ","processed: ",ld->name,"/",f,(char *)0x0,(strerr *)0x0);
      }
      while (iVar1 = fchdir(fdwdir), iVar1 == -1) {
        pause1("unable to change to initial working directory");
      }
    }
    else {
      warnx("processor failed, restart",ld->name);
      ld->fnsave[0x1a] = 't';
      unlink(ld->fnsave);
      ld->fnsave[0x1a] = 'u';
      processorstart(ld);
      while (iVar1 = fchdir(fdwdir), iVar1 == -1) {
        pause1("unable to change to initial working directory");
      }
      uVar2 = (uint)((ld->processor).len == 0);
    }
  }
  return uVar2;
}

Assistant:

unsigned int processorstop(struct logdir *ld) {
  char f[28];

  if (ld->ppid) {
    sig_unblock(sig_hangup);
    while (wait_pid(&wstat, ld->ppid) == -1)
      pause2("error waiting for processor", ld->name);
    sig_block(sig_hangup);
    ld->ppid =0;
  }
  if (ld->fddir == -1) return(1);
  while (fchdir(ld->fddir) == -1)
    pause2("unable to change directory, want processor", ld->name);
  if (wait_exitcode(wstat) != 0) {
    warnx("processor failed, restart", ld->name);
    ld->fnsave[26] ='t';
    unlink(ld->fnsave);
    ld->fnsave[26] ='u';
    processorstart(ld);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(ld->processor.len ? 0 : 1);
  }
  ld->fnsave[26] ='t';
  byte_copy(f, 26, ld->fnsave);
  f[26] ='s'; f[27] =0;
  while (rename(ld->fnsave, f) == -1)
    pause2("unable to rename processed", ld->name);
  while (chmod(f, 0744) == -1)
    pause2("unable to set mode of processed", ld->name);
  ld->fnsave[26] ='u';
  if (unlink(ld->fnsave) == -1)
    strerr_warn5(WARNING, "unable to unlink: ", ld->name, "/", ld->fnsave, 0);
  while (rename("newstate", "state") == -1)
    pause2("unable to rename state", ld->name);
  if (verbose) strerr_warn5(INFO, "processed: ", ld->name, "/", f, 0);
  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}